

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
          (TriangleDerivateCaseInstance *this,Context *context,UniformSetup *uniformSetup,
          DerivateCaseDefinition *definitions,DerivateCaseValues *values)

{
  VkFormat VVar1;
  VkSampleCountFlagBits sampleCount;
  deUint32 internalFormat;
  TextureFormat local_5c;
  Vector<unsigned_int,_2> local_54 [2];
  ShaderEvaluator local_40;
  DerivateCaseValues *local_30;
  DerivateCaseValues *values_local;
  DerivateCaseDefinition *definitions_local;
  UniformSetup *uniformSetup_local;
  Context *context_local;
  TriangleDerivateCaseInstance *this_local;
  
  local_30 = values;
  values_local = (DerivateCaseValues *)definitions;
  definitions_local = (DerivateCaseDefinition *)uniformSetup;
  uniformSetup_local = (UniformSetup *)context;
  context_local = (Context *)this;
  ShaderEvaluator::ShaderEvaluator(&local_40,(ShaderEvalFunc)0x0);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,true,&local_40,
             (UniformSetup *)definitions_local,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0)
  ;
  ShaderEvaluator::~ShaderEvaluator(&local_40);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TriangleDerivateCaseInstance_016a7f20;
  this->m_definitions = (DerivateCaseDefinition *)values_local;
  this->m_values = local_30;
  tcu::Vector<unsigned_int,_2>::Vector(local_54,99,0x85);
  *&(this->super_ShaderRenderCaseInstance).m_renderSize.m_data = local_54[0].m_data;
  internalFormat = 0x8058;
  if (this->m_definitions->surfaceType == SURFACETYPE_FLOAT_FBO) {
    internalFormat = 0x8d70;
  }
  local_5c = glu::mapGLInternalFormat(internalFormat);
  VVar1 = ::vk::mapTextureFormat(&local_5c);
  (this->super_ShaderRenderCaseInstance).m_colorFormat = VVar1;
  sampleCount = getVkSampleCount((int)(values_local->coordMax).m_data[2]);
  ShaderRenderCaseInstance::setSampleCount(&this->super_ShaderRenderCaseInstance,sampleCount);
  return;
}

Assistant:

TriangleDerivateCaseInstance::TriangleDerivateCaseInstance (Context&						context,
															const UniformSetup&				uniformSetup,
															const DerivateCaseDefinition&	definitions,
															const DerivateCaseValues&		values)
	: ShaderRenderCaseInstance	(context, true, DE_NULL, uniformSetup, DE_NULL)
	, m_definitions				(definitions)
	, m_values					(values)
{
	m_renderSize	= tcu::UVec2(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	m_colorFormat	= vk::mapTextureFormat(glu::mapGLInternalFormat(m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO ? GL_RGBA32UI : GL_RGBA8));

	setSampleCount(getVkSampleCount(definitions.numSamples));
}